

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

void __thiscall QToolBarLayout::setUsePopupMenu(QToolBarLayout *this,bool set)

{
  long lVar1;
  byte bVar2;
  void *pvVar3;
  byte in_SIL;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffc8;
  ToolButtonPopupMode mode;
  QToolButton *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  QWidget *parent;
  Connection in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  parent = in_RDI;
  if ((((ulong)in_RDI[1].data & 1) == 0) && ((*(long *)&in_RDI[3].field_0x8 == 0) == (bool)bVar2)) {
    (**(code **)(*(long *)in_RDI + 0x70))();
  }
  mode = (ToolButtonPopupMode)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if ((bVar2 & 1) == 0) {
    QObject::connect((QObject *)&stack0xfffffffffffffff0,*(char **)(in_RDI + 3),
                     (QObject *)"2clicked(bool)",(char *)in_RDI,0xb28f0d);
    QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
    QToolButton::setPopupMode(in_stack_ffffffffffffffd0,mode);
    QToolButton::setMenu((QToolButton *)parent,(QMenu *)CONCAT17(bVar2,in_stack_ffffffffffffffe0));
    if (*(long **)&in_RDI[3].field_0x8 != (long *)0x0) {
      (**(code **)(**(long **)&in_RDI[3].field_0x8 + 0x20))();
    }
    *(undefined8 *)&in_RDI[3].field_0x8 = 0;
  }
  else {
    QObject::disconnect(*(QObject **)(in_RDI + 3),"2clicked(bool)",&in_RDI->super_QObject,
                        "1setExpanded(bool)");
    QToolButton::setPopupMode(in_stack_ffffffffffffffd0,mode);
    if (*(long *)&in_RDI[3].field_0x8 == 0) {
      pvVar3 = operator_new(0x28);
      QMenu::QMenu((QMenu *)in_stack_fffffffffffffff0.d_ptr,parent);
      *(void **)&in_RDI[3].field_0x8 = pvVar3;
    }
    QToolButton::setMenu((QToolButton *)parent,(QMenu *)CONCAT17(bVar2,in_stack_ffffffffffffffe0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::setUsePopupMenu(bool set)
{
    if (!dirty && ((popupMenu == nullptr) == set))
        invalidate();
    if (!set) {
        QObject::connect(extension, SIGNAL(clicked(bool)),
                        this, SLOT(setExpanded(bool)), Qt::UniqueConnection);
        extension->setPopupMode(QToolButton::DelayedPopup);
        extension->setMenu(nullptr);
        delete popupMenu;
        popupMenu = nullptr;
    } else {
        QObject::disconnect(extension, SIGNAL(clicked(bool)),
                            this, SLOT(setExpanded(bool)));
        extension->setPopupMode(QToolButton::InstantPopup);
        if (!popupMenu) {
            popupMenu = new QMenu(extension);
        }
        extension->setMenu(popupMenu);
    }
}